

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_224::GlobalUseScanner::visitFunction(GlobalUseScanner *this,Function *curr)

{
  Expression *pEVar1;
  int *piVar2;
  mapped_type *pmVar3;
  undefined1 local_20 [8];
  Name global;
  
  pEVar1 = curr->body;
  if ((((pEVar1->type).id == 0) && (pEVar1->_id == BlockId)) && (pEVar1[2].type.id == 2)) {
    piVar2 = (int *)**(undefined8 **)(pEVar1 + 2);
    if (((*piVar2 == 2) && (*(long *)(piVar2 + 8) == 0)) && (**(int **)(piVar2 + 6) == 0x13)) {
      _local_20 = (string_view)
                  readsGlobalOnlyToWriteIt
                            (this,*(Expression **)(piVar2 + 4),
                             (Expression *)(*(undefined8 **)(pEVar1 + 2))[1]);
      if (local_20._8_8_ != (char *)0x0) {
        pmVar3 = std::
                 map<wasm::Name,_wasm::(anonymous_namespace)::GlobalInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::GlobalInfo>_>_>
                 ::operator[](this->infos,(key_type *)local_20);
        LOCK();
        (pmVar3->readOnlyToWrite).super___atomic_base<unsigned_int>._M_i =
             (pmVar3->readOnlyToWrite).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      return;
    }
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    // We are looking for a function body like this:
    //
    //   if (global == X) return;
    //   global = Y;
    //
    // And nothing else at all. Note that this does not overlap with the if
    // pattern above (the assignment is in the if body) so we will never have
    // overlapping matchings (which would each count as 1, leading to a
    // miscount).

    if (curr->body->type != Type::none) {
      return;
    }

    auto* block = curr->body->dynCast<Block>();
    if (!block) {
      return;
    }

    auto& list = block->list;
    if (list.size() != 2) {
      return;
    }

    auto* iff = list[0]->dynCast<If>();
    if (!iff || iff->ifFalse || !iff->ifTrue->is<Return>()) {
      return;
    }

    auto global = readsGlobalOnlyToWriteIt(iff->condition, list[1]);
    if (global.is()) {
      // This is exactly the pattern we sought!
      (*infos)[global].readOnlyToWrite++;
    }
  }